

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall Proxy::Connect(Proxy *this)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  char *__src;
  unsigned_long *puVar3;
  long in_RSI;
  _Head_base<0UL,_Sock_*,_false> in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000040;
  socklen_t len;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  sockaddr_un addrun;
  string path;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Proxy *in_stack_fffffffffffffe90;
  unique_ptr<Sock,_std::default_delete<Sock>_> *in_stack_fffffffffffffe98;
  function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>
  *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 *__dest;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ConstevalFormatString<1U> in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40 [15];
  undefined1 in_stack_ffffffffffffff4f;
  string *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  socklen_t in_stack_ffffffffffffff5c;
  sockaddr *in_stack_ffffffffffffff60;
  Sock *sock_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValid(in_stack_fffffffffffffe90);
  if (bVar2) {
    if ((*(byte *)(in_RSI + 0x48) & 1) == 0) {
      ConnectDirectly((CService *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      SUB81((ulong)in_RSI >> 0x38,0));
    }
    else {
      std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
                (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (int)in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffeb0,
                   CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                   (size_type)in_stack_fffffffffffffea0);
        sock_00 = (Sock *)0x1;
        __dest = &stack0xffffffffffffff6a;
        __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        puVar3 = std::min<unsigned_long>
                           ((unsigned_long *)in_stack_fffffffffffffe90,
                            (unsigned_long *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        memcpy(__dest,__src,*puVar3);
        std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*(in_stack_fffffffffffffe98);
        bVar2 = ConnectToSocket(sock_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
        if (bVar2) {
          std::unique_ptr<Sock,_std::default_delete<Sock>_>::unique_ptr
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     (unique_ptr<Sock,_std::default_delete<Sock>_> *)0xe0bf4e);
        }
        else {
          std::unique_ptr<Sock,std::default_delete<Sock>>::
          unique_ptr<std::default_delete<Sock>,void>
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      else {
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                     (char *)in_stack_fffffffffffffea0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                     (char *)in_stack_fffffffffffffea0);
          in_stack_fffffffffffffe98 =
               (unique_ptr<Sock,_std::default_delete<Sock>_> *)(in_RSI + 0x28);
          in_stack_fffffffffffffe88 = 4;
          logging_function._M_str._0_4_ = in_stack_ffffffffffffff58;
          logging_function._M_len = (size_t)in_stack_ffffffffffffff50;
          logging_function._M_str._4_4_ = in_stack_ffffffffffffff5c;
          source_file._M_str._7_1_ = in_stack_ffffffffffffff4f;
          source_file._0_15_ = in_stack_ffffffffffffff40;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,(int)((ulong)in_RSI >> 0x20),
                     (LogFlags)in_RDI._M_head_impl,in_stack_00000030,in_stack_ffffffffffffff38,
                     in_stack_00000040);
        }
        std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      }
      std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr(in_stack_fffffffffffffe98);
    }
  }
  else {
    std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
         (tuple<Sock_*,_std::default_delete<Sock>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Sock> Proxy::Connect() const
{
    if (!IsValid()) return {};

    if (!m_is_unix_socket) return ConnectDirectly(proxy, /*manual_connection=*/true);

#ifdef HAVE_SOCKADDR_UN
    auto sock = CreateSock(AF_UNIX, SOCK_STREAM, 0);
    if (!sock) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "Cannot create a socket for connecting to %s\n", m_unix_socket_path);
        return {};
    }

    const std::string path{m_unix_socket_path.substr(ADDR_PREFIX_UNIX.length())};

    struct sockaddr_un addrun;
    memset(&addrun, 0, sizeof(addrun));
    addrun.sun_family = AF_UNIX;
    // leave the last char in addrun.sun_path[] to be always '\0'
    memcpy(addrun.sun_path, path.c_str(), std::min(sizeof(addrun.sun_path) - 1, path.length()));
    socklen_t len = sizeof(addrun);

    if(!ConnectToSocket(*sock, (struct sockaddr*)&addrun, len, path, /*manual_connection=*/true)) {
        return {};
    }

    return sock;
#else
    return {};
#endif
}